

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_SetGoal(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  bool bVar1;
  uint uVar2;
  TObjPtr<AActor> *this;
  AActor *u;
  Self local_74;
  TFlags<ActorFlag,_unsigned_int> local_70;
  byte local_69;
  AActor *pAStack_68;
  bool ok;
  AActor *goal;
  AActor *self;
  undefined1 local_50 [8];
  NActorIterator goaliterator;
  TActorIterator<AActor> selfiterator;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  TActorIterator<AActor>::TActorIterator((TActorIterator<AActor> *)&goaliterator.type,arg0);
  FName::FName((FName *)((long)&self + 4),NAME_PatrolPoint);
  NActorIterator::NActorIterator((NActorIterator *)local_50,(FName *)((long)&self + 4),arg1);
  pAStack_68 = NActorIterator::Next((NActorIterator *)local_50);
  local_69 = 0;
  while (goal = TActorIterator<AActor>::Next((TActorIterator<AActor> *)&goaliterator.type),
        goal != (AActor *)0x0) {
    local_69 = 1;
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_70,(int)goal + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
    if (uVar2 != 0) {
      this = &goal->target;
      u = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&goal->goal);
      bVar1 = TObjPtr<AActor>::operator==(this,u);
      if (bVar1) {
        TObjPtr<AActor>::operator=(&goal->target,(AActor *)0x0);
      }
      TObjPtr<AActor>::operator=(&goal->goal,pAStack_68);
      if (arg3 == 0) {
        operator~((EnumType)&local_74);
        TFlags<ActorFlag5,_unsigned_int>::operator&=(&goal->flags5,&local_74);
      }
      else {
        TFlags<ActorFlag5,_unsigned_int>::operator|=(&goal->flags5,MF5_CHASEGOAL);
      }
      bVar1 = TObjPtr<AActor>::operator==(&goal->target,(AActor *)0x0);
      if (bVar1) {
        goal->reactiontime = arg2 * 0x23;
      }
    }
  }
  return (int)(local_69 & 1);
}

Assistant:

FUNC(LS_Thing_SetGoal)
// Thing_SetGoal (tid, goal, delay, chasegoal)
{
	TActorIterator<AActor> selfiterator (arg0);
	NActorIterator goaliterator (NAME_PatrolPoint, arg1);
	AActor *self;
	AActor *goal = goaliterator.Next ();
	bool ok = false;

	while ( (self = selfiterator.Next ()) )
	{
		ok = true;
		if (self->flags & MF_SHOOTABLE)
		{
			if (self->target == self->goal)
			{ // Targeting a goal already? -> don't target it anymore.
			  // A_Look will set it to the goal, presuming no real targets
			  // come into view by then.
				self->target = NULL;
			}
			self->goal = goal;
			if (arg3 == 0)
			{
				self->flags5 &= ~MF5_CHASEGOAL;
			}
			else
			{
				self->flags5 |= MF5_CHASEGOAL;
			}
			if (self->target == NULL)
			{
				self->reactiontime = arg2 * TICRATE;
			}
		}
	}

	return ok;
}